

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void __thiscall polyscope::Histogram::buildUI(Histogram *this,float width)

{
  undefined8 uVar1;
  float _y;
  bool bVar2;
  element_type *peVar3;
  ImVec4 *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  ImDrawList *this_00;
  undefined1 auVar5 [16];
  ImVec2 *p1;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ImVec4 *unaff_retaddr;
  ImVec2 *in_stack_00000008;
  ImVec2 *in_stack_00000010;
  ImVec2 *in_stack_00000018;
  ImTextureID in_stack_00000020;
  ImVec2 lineEnd;
  ImVec2 lineStart;
  bool *in_stack_00000050;
  ImVec2 imageUpperLeft;
  double val;
  double mouseT;
  float mouseX;
  float h;
  float w;
  float aspect;
  ImGuiHoveredFlags in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  ImDrawList *in_stack_ffffffffffffff38;
  ImVec4 local_b0;
  ImVec2 local_a0;
  ImVec2 local_98;
  undefined8 local_90;
  undefined8 uVar12;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float local_64;
  float local_5c;
  ImVec4 local_50;
  Histogram *in_stack_ffffffffffffffc0;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  float local_18;
  float local_14;
  ImVec4 *border_col;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_14 = in_XMM0_Da;
  border_col = in_RDI;
  renderToTexture(in_stack_ffffffffffffffc0);
  local_18 = 3.0;
  if ((local_14 == -1.0) && (!NAN(local_14))) {
    local_14 = ImGui::GetWindowWidth();
    local_14 = local_14 * 0.8;
  }
  local_18 = local_14 / local_18;
  peVar3 = std::
           __shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x41ad7c);
  (*peVar3->_vptr_TextureBuffer[8])();
  ImVec2::ImVec2(&local_20,local_14,local_18);
  ImVec2::ImVec2(&local_28,0.0,1.0);
  ImVec2::ImVec2(&local_30,1.0,0.0);
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffc0,1.0,1.0,1.0,1.0);
  ImVec4::ImVec4(&local_50,0.0,0.0,0.0,0.0);
  ImGui::Image(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr
               ,border_col);
  bVar2 = ImGui::IsItemHovered(in_stack_ffffffffffffff30);
  if (bVar2) {
    auVar6._0_8_ = ImGui::GetMousePos();
    auVar6._8_56_ = extraout_var;
    uVar12 = vmovlpd_avx(auVar6._0_16_);
    local_5c = (float)uVar12;
    auVar7._0_8_ = ImGui::GetCursorScreenPos();
    auVar7._8_56_ = extraout_var_00;
    uVar12 = vmovlpd_avx(auVar7._0_16_);
    local_64 = (float)uVar12;
    local_5c = local_5c - local_64;
    fVar4 = ImGui::GetScrollX();
    fVar4 = local_5c - fVar4;
    this_00 = (ImDrawList *)(double)(fVar4 / local_14);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = this_00;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(double *)(in_RDI + 0xb);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(double *)&in_RDI[0xb].z - *(double *)(in_RDI + 0xb);
    auVar5 = vfmadd213sd_fma(auVar5,auVar10,auVar11);
    p1 = auVar5._0_8_;
    ImGui::SetTooltip((char *)p1,"%g");
    auVar8._0_8_ = ImGui::GetCursorScreenPos();
    auVar8._8_56_ = extraout_var_01;
    uVar12 = vmovlpd_avx(auVar8._0_16_);
    in_stack_ffffffffffffff34 = (float)uVar12;
    auVar9._0_8_ = ImGui::GetCursorScreenPos();
    auVar9._8_56_ = extraout_var_02;
    uVar1 = vmovlpd_avx(auVar9._0_16_);
    local_90._4_4_ = (float)((ulong)uVar1 >> 0x20);
    _y = local_90._4_4_;
    local_90 = uVar1;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,in_stack_ffffffffffffff34,_y);
    ImVec2::ImVec2(&local_98,in_stack_ffffffffffffff80 + fVar4,
                   (in_stack_ffffffffffffff84 - local_18) - 3.0);
    ImVec2::ImVec2(&local_a0,in_stack_ffffffffffffff80 + fVar4,in_stack_ffffffffffffff84 - 4.0);
    in_stack_ffffffffffffff38 = ImGui::GetWindowDrawList();
    ImVec4::ImVec4(&local_b0,0.99607843,0.8666667,0.25882354,1.0);
    ImGui::ColorConvertFloat4ToU32((ImVec4 *)CONCAT44(in_stack_ffffffffffffff34,local_5c));
    ImDrawList::AddLine(this_00,p1,
                        (ImVec2 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (ImU32)((ulong)uVar12 >> 0x20),(float)uVar12);
  }
  bVar2 = ImGui::BeginPopupContextItem
                    ((char *)in_stack_ffffffffffffff38,(ImGuiMouseButton)in_stack_ffffffffffffff34);
  if (bVar2) {
    if (((uint)in_RDI[0xc].x & 1) != 0) {
      ImGui::Checkbox((char *)imageUpperLeft,in_stack_00000050);
    }
    ImGui::Checkbox((char *)imageUpperLeft,in_stack_00000050);
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void Histogram::buildUI(float width) {
  renderToTexture();

  // Compute size for image
  float aspect = 3.0;
  float w = width;
  if (w == -1.0) {
    w = .8 * ImGui::GetWindowWidth();
  }
  float h = w / aspect;

  // Render image
  ImGui::Image(texturebuffer->getNativeHandle(), ImVec2(w, h), ImVec2(0, 1), ImVec2(1, 0));

  // Draw a cursor popup on mouseover
  if (ImGui::IsItemHovered()) {

    // Get mouse x coodinate within image
    float mouseX = ImGui::GetMousePos().x - ImGui::GetCursorScreenPos().x - ImGui::GetScrollX();
    double mouseT = mouseX / w;
    double val = dataRange.first + mouseT * (dataRange.second - dataRange.first);

    ImGui::SetTooltip("%g", val);

    // Draw line
    ImVec2 imageUpperLeft(ImGui::GetCursorScreenPos().x, ImGui::GetCursorScreenPos().y);
    ImVec2 lineStart(imageUpperLeft.x + mouseX, imageUpperLeft.y - h - 3);
    ImVec2 lineEnd(imageUpperLeft.x + mouseX, imageUpperLeft.y - 4);
    ImGui::GetWindowDrawList()->AddLine(lineStart, lineEnd,
                                        ImGui::ColorConvertFloat4ToU32(ImVec4(254 / 255., 221 / 255., 66 / 255., 1.0)));
  }

  // Right-click combobox to select weighted/unweighted
  if (ImGui::BeginPopupContextItem("select type")) {
    if (hasWeighted) {
      ImGui::Checkbox("Weighted", &useWeighted);
    }
    ImGui::Checkbox("Smoothed", &useSmoothed);
    ImGui::EndPopup();
  }
}